

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

void __thiscall calculator::error::~error(error *this)

{
  error *in_RDI;
  
  ~error(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }